

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyDebugNamesCULists(DWARFVerifier *this,DWARFDebugNames *AccelTable)

{
  DWARFContext *pDVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  value_type *pvVar5;
  ulong uVar6;
  raw_ostream *prVar7;
  long lVar8;
  size_type NumEntries;
  undefined1 in_R8B;
  uint32_t uVar9;
  unsigned_long *puVar10;
  NameIndex *this_00;
  DenseMapPair<unsigned_long,_unsigned_long> *pDVar11;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  DenseMapPair<unsigned_long,_unsigned_long> *local_128;
  DenseMapPair<unsigned_long,_unsigned_long> *ConstFoundBucket;
  pointer local_118;
  pointer local_108;
  pointer local_100;
  pointer local_f0;
  NameIndex *local_b8;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
  local_b0;
  _func_int **local_80;
  DWARFDebugNames *local_78;
  _func_int **local_70;
  unsigned_long *local_68;
  uint64_t Offset;
  DenseMapPair<unsigned_long,_unsigned_long> *pDStack_58;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  CUMap;
  
  pDStack_58 = (DenseMapPair<unsigned_long,_unsigned_long> *)0x0;
  CUMap.Buckets = (DenseMapPair<unsigned_long,_unsigned_long> *)0x0;
  CUMap.NumEntries = 0;
  pDVar1 = this->DCtx;
  CUMap._16_8_ = this;
  DWARFContext::parseNormalUnits(pDVar1);
  NumEntries = (pDVar1->NormalUnits).NumInfoUnits;
  if (NumEntries == 0xffffffff) {
    NumEntries = (pDVar1->NormalUnits).
                 super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                 .
                 super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                 .
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 .super_SmallVectorBase.Size;
  }
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::reserve((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             *)&pDStack_58,NumEntries);
  pDVar1 = *(DWARFContext **)(CUMap._16_8_ + 8);
  local_78 = AccelTable;
  DWARFContext::parseNormalUnits(pDVar1);
  uVar4 = (pDVar1->NormalUnits).NumInfoUnits;
  if (uVar4 == 0xffffffff) {
    uVar4 = (pDVar1->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar4 != 0) {
    pvVar2 = (pDVar1->NormalUnits).
             super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
             .
             super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
             .
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    lVar8 = 0;
    do {
      local_128 = *(DenseMapPair<unsigned_long,_unsigned_long> **)
                   (*(long *)((long)pvVar2 + lVar8) + 0x18);
      pvVar5 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
               ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                                   *)&pDStack_58,(unsigned_long *)&stack0xfffffffffffffed8);
      (pvVar5->super_pair<unsigned_long,_unsigned_long>).second = 0xffffffffffffffff;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar4 * 8 != lVar8);
  }
  uVar6 = (ulong)(local_78->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                 super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                 super_SmallVectorBase.Size;
  if (uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    this_00 = (NameIndex *)
              (local_78->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
              super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
              super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
              super_SmallVectorBase.BeginX;
    local_b8 = this_00 + uVar6;
    uVar4 = 0;
    local_70 = (_func_int **)&PTR_anchor_01078920;
    local_80 = (_func_int **)&PTR_anchor_01078ba8;
    do {
      uVar9 = (this_00->Hdr).super_HeaderPOD.CompUnitCount;
      local_78 = (DWARFDebugNames *)CONCAT44(local_78._4_4_,uVar9);
      if (uVar9 == 0) {
        prVar7 = WithColor::error(*(WithColor **)CUMap._16_8_,(raw_ostream *)0xe67796,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.Item = (unsigned_long *)this_00->Base;
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
        Fmt_01.Length = 0x29;
        Fmt_01.Data = "Name Index @ {0:x} does not index any CU\n";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
        formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                        *)&stack0xfffffffffffffed8,Fmt_01,
                       (tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *)&local_b0);
        raw_ostream::operator<<(prVar7,(formatv_object_base *)&stack0xfffffffffffffed8);
        if (local_100 != (pointer)0x0) {
          operator_delete(local_100,(long)local_f0 - (long)local_100);
        }
        if (local_118 != (pointer)0x0) {
          operator_delete(local_118,(long)local_108 - (long)local_118);
        }
        uVar4 = uVar4 + 1;
      }
      else {
        uVar9 = 0;
        do {
          local_68 = (unsigned_long *)DWARFDebugNames::NameIndex::getCUOffset(this_00,uVar9);
          bVar3 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                  ::LookupBucketFor<unsigned_long>
                            ((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                              *)&pDStack_58,(unsigned_long *)&stack0xffffffffffffff98,
                             &stack0xfffffffffffffed8);
          if (bVar3 && local_128 != pDStack_58 + CUMap.NumEntries) {
            puVar10 = &(local_128->super_pair<unsigned_long,_unsigned_long>).second;
            if ((local_128->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff)
            {
              *puVar10 = this_00->Base;
            }
            else {
              prVar7 = WithColor::error(*(WithColor **)CUMap._16_8_,(raw_ostream *)0xe67796,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
              _M_head_impl.Item = this_00->Base;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
              super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.Item = (unsigned_long *)&stack0xffffffffffffff98;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
              Fmt.Length = 0x61;
              Fmt.Data = 
              "Name Index @ {0:x} references a CU @ {1:x}, but this CU is already indexed by Name Index @ {2:x}\n"
              ;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
              super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.Item = puVar10;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                                *)&stack0xfffffffffffffed8,Fmt,&local_b0);
              raw_ostream::operator<<(prVar7,(formatv_object_base *)&stack0xfffffffffffffed8);
              if (local_100 != (pointer)0x0) {
                operator_delete(local_100,(long)local_f0 - (long)local_100);
              }
              if (local_118 != (pointer)0x0) {
                operator_delete(local_118,(long)local_108 - (long)local_118);
              }
            }
          }
          else {
            prVar7 = WithColor::error(*(WithColor **)CUMap._16_8_,(raw_ostream *)0xe67796,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.Item = (unsigned_long *)this_00->Base;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.Item = (unsigned_long *)&stack0xffffffffffffff98;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
            Fmt_00.Length = 0x38;
            Fmt_00.Data = "Name Index @ {0:x} references a non-existing CU @ {1:x}\n";
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                              *)&stack0xfffffffffffffed8,Fmt_00,
                             (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
                              *)&local_b0);
            raw_ostream::operator<<(prVar7,(formatv_object_base *)&stack0xfffffffffffffed8);
            if (local_100 != (pointer)0x0) {
              operator_delete(local_100,(long)local_f0 - (long)local_100);
            }
            if (local_118 != (pointer)0x0) {
              operator_delete(local_118,(long)local_108 - (long)local_118);
            }
            uVar4 = uVar4 + 1;
          }
          uVar9 = uVar9 + 1;
        } while ((uint32_t)local_78 != uVar9);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_b8);
  }
  uVar6 = (ulong)CUMap.NumEntries;
  Offset = (uint64_t)(pDStack_58 + uVar6);
  puVar10 = (unsigned_long *)Offset;
  if ((int)CUMap.Buckets != 0) {
    local_128 = pDStack_58;
    ConstFoundBucket = (DenseMapPair<unsigned_long,_unsigned_long> *)Offset;
    DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
    ::AdvancePastEmptyBuckets
              ((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                *)&stack0xfffffffffffffed8);
    uVar6 = (ulong)CUMap.NumEntries;
    Offset = (uint64_t)ConstFoundBucket;
    puVar10 = (unsigned_long *)local_128;
  }
  pDVar11 = pDStack_58 + uVar6;
  local_68 = puVar10;
  if ((DenseMapPair<unsigned_long,_unsigned_long> *)puVar10 != pDVar11) {
    do {
      puVar10 = local_68;
      if (local_68[1] == 0xffffffffffffffff) {
        prVar7 = WithColor::warning(*(WithColor **)CUMap._16_8_,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01078980;
        Fmt_02.Length = 0x29;
        Fmt_02.Data = "CU @ {0:x} not covered by any Name Index\n";
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.Item = puVar10;
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>::
        formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
                        *)&stack0xfffffffffffffed8,Fmt_02,
                       (tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_> *)
                       &local_b0);
        raw_ostream::operator<<(prVar7,(formatv_object_base *)&stack0xfffffffffffffed8);
        if (local_100 != (pointer)0x0) {
          operator_delete(local_100,(long)local_f0 - (long)local_100);
        }
        if (local_118 != (pointer)0x0) {
          operator_delete(local_118,(long)local_108 - (long)local_118);
        }
      }
      local_68 = local_68 + 2;
      DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
      ::AdvancePastEmptyBuckets
                ((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                  *)&stack0xffffffffffffff98);
    } while ((DenseMapPair<unsigned_long,_unsigned_long> *)local_68 != pDVar11);
    uVar6 = (ulong)CUMap.NumEntries;
  }
  operator_delete(pDStack_58,uVar6 << 4,8);
  return uVar4;
}

Assistant:

unsigned
DWARFVerifier::verifyDebugNamesCULists(const DWARFDebugNames &AccelTable) {
  // A map from CU offset to the (first) Name Index offset which claims to index
  // this CU.
  DenseMap<uint64_t, uint64_t> CUMap;
  const uint64_t NotIndexed = std::numeric_limits<uint64_t>::max();

  CUMap.reserve(DCtx.getNumCompileUnits());
  for (const auto &CU : DCtx.compile_units())
    CUMap[CU->getOffset()] = NotIndexed;

  unsigned NumErrors = 0;
  for (const DWARFDebugNames::NameIndex &NI : AccelTable) {
    if (NI.getCUCount() == 0) {
      error() << formatv("Name Index @ {0:x} does not index any CU\n",
                         NI.getUnitOffset());
      ++NumErrors;
      continue;
    }
    for (uint32_t CU = 0, End = NI.getCUCount(); CU < End; ++CU) {
      uint64_t Offset = NI.getCUOffset(CU);
      auto Iter = CUMap.find(Offset);

      if (Iter == CUMap.end()) {
        error() << formatv(
            "Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
            NI.getUnitOffset(), Offset);
        ++NumErrors;
        continue;
      }

      if (Iter->second != NotIndexed) {
        error() << formatv("Name Index @ {0:x} references a CU @ {1:x}, but "
                           "this CU is already indexed by Name Index @ {2:x}\n",
                           NI.getUnitOffset(), Offset, Iter->second);
        continue;
      }
      Iter->second = NI.getUnitOffset();
    }
  }

  for (const auto &KV : CUMap) {
    if (KV.second == NotIndexed)
      warn() << formatv("CU @ {0:x} not covered by any Name Index\n", KV.first);
  }

  return NumErrors;
}